

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void name_public_member_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Fl_Class_Type *pFVar6;
  Fl_Widget_Type *w;
  Fl_Type *this;
  
  if ((char *)v == "LOAD") {
    Fl_Choice::value(i,current_widget->public_);
    pFVar6 = Fl_Type::is_in_class(&current_widget->super_Fl_Type);
    pp_Var2 = (i->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget;
    if (pFVar6 != (Fl_Class_Type *)0x0) {
      (*pp_Var2[5])();
      return;
    }
    (*pp_Var2[6])(i);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar3 = false;
    this = Fl_Type::first;
    do {
      if (this->selected != '\0') {
        iVar4 = (*this->_vptr_Fl_Type[0x17])(this);
        if (iVar4 != 0) {
          pFVar6 = Fl_Type::is_in_class(this);
          if (pFVar6 == (Fl_Class_Type *)0x0) {
            pFVar1 = (i->super_Fl_Menu_).value_;
            if (pFVar1 == (Fl_Menu_Item *)0x0) {
              uVar5 = 0;
            }
            else {
              uVar5 = (uint)(0 < (int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3)
                                 * -0x49249249);
            }
          }
          else {
            pFVar1 = (i->super_Fl_Menu_).value_;
            if (pFVar1 == (Fl_Menu_Item *)0x0) {
              uVar5 = 0xffffffff;
            }
            else {
              uVar5 = (int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                      -0x49249249;
            }
          }
          *(uint *)&this[1].factory = uVar5;
          bVar3 = true;
        }
      }
      this = this->next;
    } while (this != (Fl_Type *)0x0);
    if (bVar3) {
      set_modflag(1);
      redraw_browser();
      return;
    }
  }
  return;
}

Assistant:

void name_public_member_cb(Fl_Choice* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->public_);
    if (current_widget->is_in_class()) i->show(); else i->hide();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        Fl_Widget_Type *w = ((Fl_Widget_Type*)o);
        if (w->is_in_class()) {
          w->public_ = i->value();
        } else {
          // if this is not in a class, it can be only private or public
          w->public_ = (i->value()>0);
        }
	mod = 1;
      }
    }
    if (mod) {
      set_modflag(1);
      redraw_browser();
    }
  }
}